

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

char common_sampler_type_to_chr(common_sampler_type cnstr)

{
  common_sampler_type cnstr_local;
  char local_1;
  
  switch(cnstr) {
  case COMMON_SAMPLER_TYPE_DRY:
    local_1 = 'd';
    break;
  case COMMON_SAMPLER_TYPE_TOP_K:
    local_1 = 'k';
    break;
  case COMMON_SAMPLER_TYPE_TOP_P:
    local_1 = 'p';
    break;
  case COMMON_SAMPLER_TYPE_MIN_P:
    local_1 = 'm';
    break;
  default:
    local_1 = '?';
    break;
  case COMMON_SAMPLER_TYPE_TYPICAL_P:
    local_1 = 'y';
    break;
  case COMMON_SAMPLER_TYPE_TEMPERATURE:
    local_1 = 't';
    break;
  case COMMON_SAMPLER_TYPE_XTC:
    local_1 = 'x';
    break;
  case COMMON_SAMPLER_TYPE_INFILL:
    local_1 = 'i';
    break;
  case COMMON_SAMPLER_TYPE_PENALTIES:
    local_1 = 'e';
  }
  return local_1;
}

Assistant:

char common_sampler_type_to_chr(enum common_sampler_type cnstr) {
    switch (cnstr) {
        case COMMON_SAMPLER_TYPE_DRY:         return 'd';
        case COMMON_SAMPLER_TYPE_TOP_K:       return 'k';
        case COMMON_SAMPLER_TYPE_TYPICAL_P:   return 'y';
        case COMMON_SAMPLER_TYPE_TOP_P:       return 'p';
        case COMMON_SAMPLER_TYPE_MIN_P:       return 'm';
        case COMMON_SAMPLER_TYPE_TEMPERATURE: return 't';
        case COMMON_SAMPLER_TYPE_XTC:         return 'x';
        case COMMON_SAMPLER_TYPE_INFILL:      return 'i';
        case COMMON_SAMPLER_TYPE_PENALTIES:   return 'e';
        default : return '?';
    }
}